

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymt.cpp
# Opt level: O2

void ymt::UpdateUsers(void)

{
  bool bVar1;
  int iVar2;
  size_t stop;
  long lVar3;
  string *value;
  pointer this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator local_63a;
  allocator_type local_639;
  allocator local_638;
  allocator local_637;
  allocator local_636;
  allocator local_635;
  allocator local_634;
  allocator local_633;
  allocator local_632;
  allocator local_631;
  string *local_630;
  string *local_628;
  string *local_620;
  string *local_618;
  string *local_610;
  string *local_608;
  pointer local_600;
  YAML l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  yaml_content;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  Parser user;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  Parser default_config;
  
  Parser::Parser(&default_config);
  std::__cxx11::string::string((string *)&local_538,(string *)&config__abi_cxx11_);
  util::ReadFile(&yaml_content,&local_538);
  std::__cxx11::string::~string((string *)&local_538);
  local_600 = yaml_content.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_608 = &user.user_pass_;
  local_610 = &user.method_;
  local_618 = &user.dns_;
  local_620 = &user.tcp_fastopen_;
  local_628 = &user.redirect_;
  local_630 = &user.server_;
  this = yaml_content.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (this == local_600) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&yaml_content);
      Parser::~Parser(&default_config);
      return;
    }
    if (this->_M_string_length != 0) {
      stop = std::__cxx11::string::find((char *)this,0x110e40);
      if (stop != 0xffffffffffffffff) {
        std::__cxx11::string::string((string *)&local_1b8,(string *)this);
        util::SubString(&user.remote_port_,&local_1b8,0,stop);
        std::__cxx11::string::operator=((string *)this,(string *)&user);
        std::__cxx11::string::~string((string *)&user);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      if (this->_M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_1d8,(string *)this);
        util::DecodeYamlLine(&l,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        if (l.level == 0) {
          std::__cxx11::string::string((string *)&local_558,(string *)&l.left);
          std::__cxx11::string::string((string *)&user,"group",&local_63a);
          std::__cxx11::string::string((string *)&user.local_port_,"nameserver",&local_631);
          std::__cxx11::string::string((string *)&user.user_pass_,"method",&local_632);
          std::__cxx11::string::string((string *)&user.method_,"fastopen",&local_633);
          std::__cxx11::string::string((string *)&user.dns_,"redirect",&local_634);
          std::__cxx11::string::string((string *)&user.tcp_fastopen_,"timeout",&local_635);
          std::__cxx11::string::string((string *)&user.redirect_,"server",&local_636);
          std::__cxx11::string::string((string *)&user.timeout_,"tunnel_mode",&local_637);
          std::__cxx11::string::string((string *)&user.server_,"verbose",&local_638);
          __l._M_len = 9;
          __l._M_array = &user.remote_port_;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_398,__l,&local_639);
          iVar2 = util::MatchWithWords(&local_558,&local_398);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_398);
          lVar3 = 0x100;
          do {
            std::__cxx11::string::~string
                      ((string *)((long)&user.remote_port_._M_dataplus._M_p + lVar3));
            lVar3 = lVar3 + -0x20;
          } while (lVar3 != -0x20);
          std::__cxx11::string::~string((string *)&local_558);
          switch(iVar2) {
          case 0:
            std::__cxx11::string::string((string *)&local_3b8,(string *)&l.right);
            value = &local_3b8;
            Parser::SetAttribute(&default_config,GROUP_NAME,value);
            break;
          case 1:
            std::__cxx11::string::string((string *)&local_598,"localhost",(allocator *)&user);
            std::__cxx11::string::string((string *)&local_578,(string *)&l.right);
            bVar1 = util::IsTheSame(&local_598,&local_578,false,false);
            if (bVar1) {
              std::__cxx11::string::~string((string *)&local_578);
              std::__cxx11::string::~string((string *)&local_598);
            }
            else {
              std::__cxx11::string::string((string *)&local_3d8,"bind9-local",&local_63a);
              std::__cxx11::string::string((string *)&local_1f8,(string *)&l.right);
              bVar1 = util::IsTheSame(&local_3d8,&local_1f8,false,false);
              std::__cxx11::string::~string((string *)&local_1f8);
              std::__cxx11::string::~string((string *)&local_3d8);
              std::__cxx11::string::~string((string *)&local_578);
              std::__cxx11::string::~string((string *)&local_598);
              if (!bVar1) {
                std::__cxx11::string::string((string *)&local_418,(string *)&l.right);
                value = &local_418;
                Parser::SetAttribute(&default_config,DNS,value);
                break;
              }
            }
            util::GetMachineIP_abi_cxx11_();
            value = &local_3f8;
            Parser::SetAttribute(&default_config,DNS,value);
            break;
          case 2:
            std::__cxx11::string::string((string *)&local_438,(string *)&l.right);
            value = &local_438;
            Parser::SetAttribute(&default_config,METHOD,value);
            break;
          case 3:
            std::__cxx11::string::string((string *)&local_458,(string *)&l.right);
            value = &local_458;
            Parser::SetAttribute(&default_config,TCP_FASTOPEN,value);
            break;
          case 4:
            std::__cxx11::string::string((string *)&local_478,(string *)&l.right);
            value = &local_478;
            Parser::SetAttribute(&default_config,REDIRECT,value);
            break;
          case 5:
            std::__cxx11::string::string((string *)&local_498,(string *)&l.right);
            value = &local_498;
            Parser::SetAttribute(&default_config,TIMEOUT,value);
            break;
          case 6:
            std::__cxx11::string::string((string *)&local_4b8,(string *)&l.right);
            value = &local_4b8;
            Parser::SetAttribute(&default_config,SERVER,value);
            break;
          case 7:
            std::__cxx11::string::string((string *)&local_4d8,(string *)&l.right);
            value = &local_4d8;
            Parser::SetAttribute(&default_config,UDP_OR_TCP,value);
            break;
          case 8:
            std::__cxx11::string::string((string *)&local_4f8,(string *)&l.right);
            value = &local_4f8;
            Parser::SetAttribute(&default_config,VERBOSE,value);
            break;
          default:
            goto switchD_0010a349_default;
          }
          std::__cxx11::string::~string((string *)value);
        }
        else {
          Parser::Parser(&user,&default_config);
          std::__cxx11::string::string((string *)&local_518,(string *)&l.left);
          std::__cxx11::string::string((string *)&local_218,(string *)&l.right);
          Parser::SetUser(&user,&local_518,&local_218);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_518);
          std::vector<Parser,_std::allocator<Parser>_>::push_back(&users_,&user);
          Parser::~Parser(&user);
        }
switchD_0010a349_default:
        YAML::~YAML(&l);
      }
    }
    this = this + 1;
  } while( true );
}

Assistant:

void ymt::UpdateUsers() {

	//Make template configuration (Can be modified by config)
	Parser default_config;

	//Read raw config
	vector <string> yaml_content = util::ReadFile(config_);

	//Parse YAML
	for (string& line : yaml_content) {

		//Skip blanklines & comments
		if (line.empty()) continue;
		else {
			size_t slash_pos = line.find("//");
			if (slash_pos != -1) {
				line = util::SubString(line, 0, slash_pos);
			}
			if (line.empty()) continue;
		}


		YAML l = util::DecodeYamlLine(line);

		//If it is global level -- no user
		if (l.level == 0) {
			switch (util::MatchWithWords(l.left,
										 { "group",
										  "nameserver",
										  "method",
										  "fastopen",
										  "redirect",
										  "timeout",
										  "server",
										  "tunnel_mode",
										  "verbose" })) {
			case 0:
				default_config.SetAttribute(GROUP_NAME, l.right);
				break;
			case 1:
				if (util::IsTheSame("localhost", l.right, false, false) ||
					util::IsTheSame("bind9-local", l.right, false, false)) {
					default_config.SetAttribute(DNS, util::GetMachineIP());
				}
				else {
					default_config.SetAttribute(DNS, l.right);
				}
				break;
			case 2:
				default_config.SetAttribute(METHOD, l.right);
				break;
			case 3:
				default_config.SetAttribute(TCP_FASTOPEN, l.right);
				break;
			case 4:
				default_config.SetAttribute(REDIRECT, l.right);
				break;
			case 5:
				default_config.SetAttribute(TIMEOUT, l.right);
				break;
			case 6:
				default_config.SetAttribute(SERVER, l.right);
				break;
			case 7:
				default_config.SetAttribute(UDP_OR_TCP, l.right);
				break;
			case 8:
				default_config.SetAttribute(VERBOSE, l.right);
				break;

			default:
				break;
			}
		}
		else {
			Parser user = default_config;
			user.SetUser(l.left, l.right);
			users_.push_back(user);
		}
	}
}